

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O3

string * __thiscall
HdmiCecAnalyzerResults::GetNumberString_abi_cxx11_
          (string *__return_storage_ptr__,HdmiCecAnalyzerResults *this,U64 number,int bits)

{
  size_t sVar1;
  char str [128];
  char acStack_98 [136];
  
  AnalyzerHelpers::GetNumberString(number,this->mDisplayBase,bits,acStack_98,0x80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_98,acStack_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string HdmiCecAnalyzerResults::GetNumberString( U64 number, int bits )
{
    const int strLen = 128;
    char str[ strLen ];
    AnalyzerHelpers::GetNumberString( number, mDisplayBase, bits, str, strLen );
    return std::string( str );
}